

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

int NULLCMemory::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int extraout_EAX;
  void *pvVar1;
  long in_RCX;
  uint in_EDX;
  char *error;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  
  if (dst == (EVP_PKEY_CTX *)0x0) {
LAB_002300dc:
    error = "buffer is empty";
  }
  else {
    if ((int)in_EDX < 0) {
LAB_002300e5:
      error = "offset is negative";
      goto LAB_002300ec;
    }
    if ((int)in_stack_00000008 < 0) {
      error = "element count is negative";
      goto LAB_002300ec;
    }
    if (in_EDX < (uint)src && in_stack_00000008 <= (uint)src - in_EDX) {
      if (in_RCX == 0) goto LAB_002300dc;
      if ((int)in_R9D < 0) goto LAB_002300e5;
      if (in_R9D < in_R8D && in_stack_00000008 <= in_R8D - in_R9D) {
        pvVar1 = memcpy(dst + in_EDX,(void *)(in_RCX + (ulong)in_R9D),(ulong)in_stack_00000008);
        return (int)pvVar1;
      }
    }
    error = "buffer overflow";
  }
LAB_002300ec:
  nullcThrowError(error);
  return extraout_EAX;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}